

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node *
lyd_create_anydata(lyd_node *parent,lys_node *schema,void *value,LYD_ANYDATA_VALUETYPE value_type)

{
  int iVar1;
  hash_table *phVar2;
  bool bVar3;
  int len;
  lyd_node_anydata *ret;
  lyd_node *iter;
  LYD_ANYDATA_VALUETYPE value_type_local;
  void *value_local;
  lys_node *schema_local;
  lyd_node *parent_local;
  
  parent_local = (lyd_node *)calloc(1,0x40);
  if (parent_local == (lyd_node *)0x0) {
    ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
           "lyd_create_anydata");
    return (lyd_node *)0x0;
  }
  parent_local->schema = schema;
  iVar1 = ly_new_node_validity(schema);
  parent_local->validity = (uint8_t)iVar1;
  iVar1 = resolve_applies_when(schema,0,(lys_node *)0x0);
  if (iVar1 != 0) {
    parent_local->field_0x9 = parent_local->field_0x9 & 0xf1 | 8;
  }
  parent_local->prev = parent_local;
  iter._4_4_ = value_type;
  switch(value_type) {
  case LYD_ANYDATA_CONSTSTRING:
  case LYD_ANYDATA_JSON:
  case LYD_ANYDATA_SXML:
    phVar2 = (hash_table *)lydict_insert(schema->module->ctx,(char *)value,0);
    parent_local->ht = phVar2;
    break;
  case LYD_ANYDATA_STRING:
  case LYD_ANYDATA_JSOND:
  case LYD_ANYDATA_SXMLD:
    phVar2 = (hash_table *)lydict_insert_zc(schema->module->ctx,(char *)value);
    parent_local->ht = phVar2;
    iter._4_4_ = value_type & ~LYD_ANYDATA_STRING;
    break;
  case LYD_ANYDATA_XML:
    parent_local->ht = (hash_table *)value;
    break;
  case LYD_ANYDATA_DATATREE:
    parent_local->ht = (hash_table *)value;
    break;
  case LYD_ANYDATA_LYB:
    iVar1 = lyd_lyb_data_length((char *)value);
    if (iVar1 == -1) {
      ly_log(schema->module->ctx,LY_LLERR,LY_EINVAL,"Invalid LYB data.");
      return (lyd_node *)0x0;
    }
    phVar2 = (hash_table *)malloc((long)iVar1);
    parent_local->ht = phVar2;
    if (parent_local->ht == (hash_table *)0x0) {
      ly_log(schema->module->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
             "lyd_create_anydata");
      free(parent_local);
      return (lyd_node *)0x0;
    }
    memcpy(parent_local->ht,value,(long)iVar1);
    break;
  case LYD_ANYDATA_LYBD:
    parent_local->ht = (hash_table *)value;
    iter._4_4_ = value_type & ~LYD_ANYDATA_STRING;
  }
  *(LYD_ANYDATA_VALUETYPE *)&parent_local->field_0x34 = iter._4_4_;
  lyd_hash(parent_local);
  if (parent != (lyd_node *)0x0) {
    iVar1 = lyd_insert(parent,parent_local);
    ret = (lyd_node_anydata *)parent;
    if (iVar1 == 0) {
      while( true ) {
        bVar3 = false;
        if (ret != (lyd_node_anydata *)0x0) {
          bVar3 = (ret->field_0x9 & 1) != 0;
        }
        if (!bVar3) break;
        ret->field_0x9 = ret->field_0x9 & 0xfe;
        ret = (lyd_node_anydata *)ret->parent;
      }
    }
    else {
      lyd_free(parent_local);
      parent_local = (lyd_node *)0x0;
    }
  }
  return parent_local;
}

Assistant:

static struct lyd_node *
lyd_create_anydata(struct lyd_node *parent, const struct lys_node *schema, void *value,
                   LYD_ANYDATA_VALUETYPE value_type)
{
    struct lyd_node *iter;
    struct lyd_node_anydata *ret;
    int len;

    ret = calloc(1, sizeof *ret);
    LY_CHECK_ERR_RETURN(!ret, LOGMEM(schema->module->ctx), NULL);

    ret->schema = (struct lys_node *)schema;
    ret->validity = ly_new_node_validity(schema);
    if (resolve_applies_when(schema, 0, NULL)) {
        ret->when_status = LYD_WHEN;
    }
    ret->prev = (struct lyd_node *)ret;

    /* set the value */
    switch (value_type) {
    case LYD_ANYDATA_CONSTSTRING:
    case LYD_ANYDATA_SXML:
    case LYD_ANYDATA_JSON:
        ret->value.str = lydict_insert(schema->module->ctx, (const char *)value, 0);
        break;
    case LYD_ANYDATA_STRING:
    case LYD_ANYDATA_SXMLD:
    case LYD_ANYDATA_JSOND:
        ret->value.str = lydict_insert_zc(schema->module->ctx, (char *)value);
        value_type &= ~LYD_ANYDATA_STRING; /* make const string from string */
        break;
    case LYD_ANYDATA_DATATREE:
        ret->value.tree = (struct lyd_node *)value;
        break;
    case LYD_ANYDATA_XML:
        ret->value.xml = (struct lyxml_elem *)value;
        break;
    case LYD_ANYDATA_LYB:
        len = lyd_lyb_data_length(value);
        if (len == -1) {
            LOGERR(schema->module->ctx, LY_EINVAL, "Invalid LYB data.");
            return NULL;
        }
        ret->value.mem = malloc(len);
        LY_CHECK_ERR_RETURN(!ret->value.mem, LOGMEM(schema->module->ctx); free(ret), NULL);
        memcpy(ret->value.mem, value, len);
        break;
    case LYD_ANYDATA_LYBD:
        ret->value.mem = value;
        value_type &= ~LYD_ANYDATA_STRING; /* make const string from string */
        break;
    }
    ret->value_type = value_type;

#ifdef LY_ENABLED_CACHE
    lyd_hash((struct lyd_node *)ret);
#endif

    /* connect to parent */
    if (parent) {
        if (lyd_insert(parent, (struct lyd_node*)ret)) {
            lyd_free((struct lyd_node*)ret);
            return NULL;
        }

        /* remove the flag from parents */
        for (iter = parent; iter && iter->dflt; iter = iter->parent) {
            iter->dflt = 0;
        }
    }

    return (struct lyd_node*)ret;
}